

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

bool caffe::UpgradeV0Net(NetParameter *v0_net_param_padding_layers,NetParameter *net_param)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int32 value;
  V1LayerParameter *v0_layer_connection;
  V1LayerParameter *layer_param;
  string *psVar4;
  int local_d4;
  int local_d0;
  int i_2;
  int i_1;
  int i;
  bool is_fully_compatible;
  undefined1 local_b8 [8];
  NetParameter v0_net_param;
  NetParameter *net_param_local;
  NetParameter *v0_net_param_padding_layers_local;
  
  v0_net_param._152_8_ = net_param;
  NetParameter::NetParameter((NetParameter *)local_b8);
  UpgradeV0PaddingLayers(v0_net_param_padding_layers,(NetParameter *)local_b8);
  i_1._3_1_ = true;
  NetParameter::Clear((NetParameter *)v0_net_param._152_8_);
  bVar2 = NetParameter::has_name((NetParameter *)local_b8);
  uVar1 = v0_net_param._152_8_;
  if (bVar2) {
    psVar4 = NetParameter::name_abi_cxx11_((NetParameter *)local_b8);
    NetParameter::set_name((NetParameter *)uVar1,psVar4);
  }
  for (i_2 = 0; iVar3 = NetParameter::layers_size((NetParameter *)local_b8), i_2 < iVar3;
      i_2 = i_2 + 1) {
    v0_layer_connection = NetParameter::layers((NetParameter *)local_b8,i_2);
    layer_param = NetParameter::add_layers((NetParameter *)v0_net_param._152_8_);
    bVar2 = UpgradeV0LayerParameter(v0_layer_connection,layer_param);
    i_1._3_1_ = (i_1._3_1_ & bVar2) != 0;
  }
  for (local_d0 = 0; iVar3 = NetParameter::input_size((NetParameter *)local_b8),
      uVar1 = v0_net_param._152_8_, local_d0 < iVar3; local_d0 = local_d0 + 1) {
    psVar4 = NetParameter::input_abi_cxx11_((NetParameter *)local_b8,local_d0);
    NetParameter::add_input((NetParameter *)uVar1,psVar4);
  }
  for (local_d4 = 0; iVar3 = NetParameter::input_dim_size((NetParameter *)local_b8),
      uVar1 = v0_net_param._152_8_, local_d4 < iVar3; local_d4 = local_d4 + 1) {
    value = NetParameter::input_dim((NetParameter *)local_b8,local_d4);
    NetParameter::add_input_dim((NetParameter *)uVar1,value);
  }
  bVar2 = NetParameter::has_force_backward((NetParameter *)local_b8);
  uVar1 = v0_net_param._152_8_;
  if (bVar2) {
    bVar2 = NetParameter::force_backward((NetParameter *)local_b8);
    NetParameter::set_force_backward((NetParameter *)uVar1,bVar2);
  }
  NetParameter::~NetParameter((NetParameter *)local_b8);
  return i_1._3_1_;
}

Assistant:

bool UpgradeV0Net(const NetParameter& v0_net_param_padding_layers,
                  NetParameter* net_param) {
  // First upgrade padding layers to padded conv layers.
  NetParameter v0_net_param;
  UpgradeV0PaddingLayers(v0_net_param_padding_layers, &v0_net_param);
  // Now upgrade layer parameters.
  bool is_fully_compatible = true;
  net_param->Clear();
  if (v0_net_param.has_name()) {
    net_param->set_name(v0_net_param.name());
  }
  for (int i = 0; i < v0_net_param.layers_size(); ++i) {
    is_fully_compatible &= UpgradeV0LayerParameter(v0_net_param.layers(i),
                                                   net_param->add_layers());
  }
  for (int i = 0; i < v0_net_param.input_size(); ++i) {
    net_param->add_input(v0_net_param.input(i));
  }
  for (int i = 0; i < v0_net_param.input_dim_size(); ++i) {
    net_param->add_input_dim(v0_net_param.input_dim(i));
  }
  if (v0_net_param.has_force_backward()) {
    net_param->set_force_backward(v0_net_param.force_backward());
  }
  return is_fully_compatible;
}